

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_set_format.c
# Opt level: O3

int archive_read_set_format(archive *_a,int code)

{
  ulong uVar1;
  uint3 uVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  char *__s1;
  char str [10];
  undefined8 local_40;
  
  iVar4 = archive_read_support_format_by_code(_a,code);
  if (iVar4 < 0) {
    return iVar4;
  }
  iVar4 = -0x14;
  if (_a[0x15].archive_format_name == (char *)0x0) {
    iVar4 = 0;
  }
  uVar2 = local_40._5_3_;
  switch((code & 0xff0000U) - 0x10000 >> 0x10) {
  case 0:
    local_40 = (ulong)uVar2 << 0x28;
    local_40 = CONCAT44(local_40._4_4_,0x6f697063);
    break;
  default:
    archive_set_error(_a,0x16,"Invalid format code specified");
    return -0x1e;
  case 2:
    local_40 = CONCAT44(local_40._4_4_,0x726174);
    break;
  case 3:
    local_40 = 0x303636396f7369;
    break;
  case 4:
    local_40 = CONCAT44(local_40._4_4_,0x70697a);
    break;
  case 6:
    uVar1 = (ulong)local_40 >> 0x10;
    local_40 = CONCAT62((uint6)uVar1 & 0xffffffffff00,0x7261);
    break;
  case 7:
    local_40 = CONCAT26(local_40._6_2_,0x6500000000);
    local_40 = CONCAT44(local_40._4_4_,0x6572746d);
    break;
  case 9:
    local_40 = CONCAT44(local_40._4_4_,0x726178);
    break;
  case 10:
    local_40 = CONCAT44(local_40._4_4_,0x61686c);
    break;
  case 0xb:
    local_40 = CONCAT44(local_40._4_4_,0x626163);
    break;
  case 0xc:
    local_40 = CONCAT44(local_40._4_4_,0x726172);
    break;
  case 0xd:
    local_40 = (ulong)uVar2 << 0x28;
    local_40 = CONCAT44(local_40._4_4_,0x70697a37);
  }
  _a[0x15].archive_format_name = (char *)&_a[8].error_string.length;
  iVar7 = 0x10;
  piVar3 = &_a[9].file_count;
  do {
    piVar6 = piVar3;
    __s1 = *(char **)(piVar6 + -0x14);
    if (__s1 == (char *)0x0) goto LAB_00120b9b;
    iVar5 = strcmp(__s1,(char *)&local_40);
    if (iVar5 == 0) goto LAB_00120b8a;
    _a[0x15].archive_format_name = (char *)piVar6;
    iVar7 = iVar7 + -1;
    piVar3 = piVar6 + 0x16;
  } while (iVar7 != 0);
  __s1 = *(char **)(piVar6 + 2);
  if (__s1 != (char *)0x0) {
LAB_00120b8a:
    iVar7 = strcmp(__s1,(char *)&local_40);
    if (iVar7 == 0) {
      iVar7 = 0;
      goto LAB_00120bba;
    }
  }
LAB_00120b9b:
  archive_set_error(_a,0x16,"Internal error: Unable to set format");
  iVar7 = -0x1e;
LAB_00120bba:
  if (iVar7 < iVar4) {
    iVar4 = iVar7;
  }
  return iVar4;
}

Assistant:

int
archive_read_set_format(struct archive *_a, int code)
{
  int r1, r2, slots, i;
  char str[10];
  struct archive_read *a = (struct archive_read *)_a;

  if ((r1 = archive_read_support_format_by_code(_a, code)) < (ARCHIVE_OK))
    return r1;

  r1 = r2 = (ARCHIVE_OK);
  if (a->format)
    r2 = (ARCHIVE_WARN);
  switch (code & ARCHIVE_FORMAT_BASE_MASK)
  {
    case ARCHIVE_FORMAT_7ZIP:
      strcpy(str, "7zip");
      break;
    case ARCHIVE_FORMAT_AR:
      strcpy(str, "ar");
      break;
    case ARCHIVE_FORMAT_CAB:
      strcpy(str, "cab");
      break;
    case ARCHIVE_FORMAT_CPIO:
      strcpy(str, "cpio");
      break;
    case ARCHIVE_FORMAT_ISO9660:
      strcpy(str, "iso9660");
      break;
    case ARCHIVE_FORMAT_LHA:
      strcpy(str, "lha");
      break;
    case ARCHIVE_FORMAT_MTREE:
      strcpy(str, "mtree");
      break;
    case ARCHIVE_FORMAT_RAR:
      strcpy(str, "rar");
      break;
    case ARCHIVE_FORMAT_TAR:
      strcpy(str, "tar");
      break;
    case ARCHIVE_FORMAT_XAR:
      strcpy(str, "xar");
      break;
    case ARCHIVE_FORMAT_ZIP:
      strcpy(str, "zip");
      break;
    default:
      archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
          "Invalid format code specified");
      return (ARCHIVE_FATAL);
  }

  slots = sizeof(a->formats) / sizeof(a->formats[0]);
  a->format = &(a->formats[0]);
  for (i = 0; i < slots; i++, a->format++) {
    if (!a->format->name || !strcmp(a->format->name, str))
      break;
  }
  if (!a->format->name || strcmp(a->format->name, str))
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
        "Internal error: Unable to set format");
    r1 = (ARCHIVE_FATAL);
  }

  return (r1 < r2) ? r1 : r2;
}